

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_uint64_partial_array(coda_cursor *cursor,long offset,long length,uint64_t *dst)

{
  coda_type_class cVar1;
  int iVar2;
  long in_RAX;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *message;
  coda_native_type native_type;
  coda_type *pcVar7;
  long num_elements;
  long local_38;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar7 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar7 == (coda_type *)0x0)) {
    pcVar4 = "invalid cursor argument (%s:%u)";
    uVar5 = 0x1372;
LAB_0012ad0d:
    coda_set_error(-100,pcVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,uVar5);
    return -1;
  }
  if (dst == (uint64_t *)0x0) {
    pcVar4 = "dst argument is NULL (%s:%u)";
    uVar5 = 0x1377;
    goto LAB_0012ad0d;
  }
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  if (pcVar7->type_class != coda_array_class) {
    pcVar4 = coda_type_get_class_name(pcVar7->type_class);
    message = "cursor does not refer to an array (current type is %s)";
    goto LAB_0012ad4e;
  }
  local_38 = in_RAX;
  piVar3 = (int *)__tls_get_addr(&PTR_001d9fe0);
  if (*piVar3 != 0) {
    iVar2 = coda_cursor_get_num_elements(cursor,&local_38);
    if (iVar2 != 0) {
      return -1;
    }
    if (offset < 0 || local_38 <= offset) {
      coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",offset,local_38);
      return -1;
    }
    if (local_38 < length + offset) {
      coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",offset,
                     length);
      return -1;
    }
  }
  pcVar7 = *(coda_type **)(pcVar7 + 1);
  cVar1 = pcVar7->type_class;
  piVar3 = (int *)__tls_get_addr(&PTR_001d9ea8);
  if (((cVar1 == coda_integer_class) || (cVar1 == coda_real_class)) &&
     ((*piVar3 != 0 && (native_type = coda_native_type_double, pcVar7[1].name != (char *)0x0)))) {
switchD_0012adba_caseD_2:
    pcVar4 = coda_type_get_native_type_name(native_type);
    message = "can not read %s data using a uint64 data type";
LAB_0012ad4e:
    coda_set_error(-0x69,message,pcVar4);
    return -1;
  }
  native_type = pcVar7->read_type;
  switch(native_type) {
  case coda_native_type_uint8:
    iVar2 = read_uint8_partial_array(cursor,offset,length,(uint8_t *)dst);
    if (iVar2 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar6 = length + 1;
      do {
        dst[uVar6 - 2] = (ulong)*(byte *)((long)dst + (uVar6 - 2));
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
    break;
  default:
    goto switchD_0012adba_caseD_2;
  case coda_native_type_uint16:
    iVar2 = read_uint16_partial_array(cursor,offset,length,(uint16_t *)dst);
    if (iVar2 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar6 = length + 1;
      do {
        dst[uVar6 - 2] = (ulong)*(ushort *)((long)dst + uVar6 * 2 + -4);
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
    break;
  case coda_native_type_uint32:
    iVar2 = read_uint32_partial_array(cursor,offset,length,(uint32_t *)dst);
    if (iVar2 != 0) {
      return -1;
    }
    if (0 < length) {
      uVar6 = length + 1;
      do {
        dst[uVar6 - 2] = (ulong)*(uint *)((long)dst + uVar6 * 4 + -8);
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
    break;
  case coda_native_type_uint64:
    iVar2 = read_uint64_partial_array(cursor,offset,length,dst);
    if (iVar2 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

LIBCODA_API int coda_cursor_read_uint64_partial_array(const coda_cursor *cursor, long offset, long length,
                                                      uint64_t *dst)
{
    coda_native_type read_type;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint32:
            if (read_uint32_partial_array(cursor, offset, length, (uint32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (uint64_t)((uint32_t *)dst)[i];
            }
            break;
        case coda_native_type_uint64:
            if (read_uint64_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a uint64 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}